

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_descriptor.c
# Opt level: O0

void plugin_descriptor_destroy(plugin_descriptor descriptor)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    dynlink_unload((dynlink)0x1204a8);
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void plugin_descriptor_destroy(plugin_descriptor descriptor)
{
	if (descriptor != NULL)
	{
		dynlink_unload(descriptor->handle);

		if (descriptor->library_name != NULL)
		{
			free(descriptor->library_name);
		}

		if (descriptor->symbol_iface_name != NULL)
		{
			free(descriptor->symbol_iface_name);
		}

		free(descriptor);
	}
}